

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test
::TestBody(MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  char *message;
  char *in_R9;
  string local_3a8;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_;
  string_view local_350;
  undefined1 local_340 [8];
  MessageDifferencer differencer;
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),1);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)((long)&msg2.field_0 + 0xa0),2);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,2);
  proto2_unittest::TestDiffMessage::add_rv((TestDiffMessage *)local_180,1);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_340);
  pDVar2 = proto2_unittest::TestDiffMessage::descriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_350,"rv");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,local_350);
  util::MessageDifferencer::TreatAsList((MessageDifferencer *)local_340,pFVar3);
  pDVar2 = proto2_unittest::TestDiffMessage::descriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,"rv");
  pFVar3 = Descriptor::FindFieldByName(pDVar2,stack0xfffffffffffffca0);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_340,pFVar3);
  local_371 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_340,(Message *)((long)&msg2.field_0 + 0xa0),
                         (Message *)local_180);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,(internal *)local_370,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x5e0,message);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_340);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldTreatmentChangeListToSet) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(1);
  msg1.add_rv(2);
  msg2.add_rv(2);
  msg2.add_rv(1);

  util::MessageDifferencer differencer;
  differencer.TreatAsList(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));
  differencer.TreatAsSet(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));

  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}